

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

void done_gesture_proc(Am_Object *cmd)

{
  int iVar1;
  char cVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object cls;
  Am_Value_List examples;
  Am_Object example;
  Am_String class_name;
  Am_Feature_Vector feat;
  Am_Object inter;
  Am_Point_List pl;
  Am_Object local_a0;
  Am_String local_98 [2];
  Am_Object local_88;
  Am_String local_80;
  Am_Feature_Vector local_78 [8];
  Am_Object local_70;
  Am_Feature_Vector local_68 [8];
  Am_Feature_Vector local_60 [8];
  Am_String local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Point_List local_40;
  
  Am_Object::Get_Object((ushort)&local_50,(ulong)cmd);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_50,0xb2);
  Am_Point_List::Am_Point_List(&local_40,pAVar3);
  Am_Feature_Vector::Am_Feature_Vector(local_78,&local_40);
  pAVar3 = (Am_Value *)Am_Object::Get(0x560,0x169);
  Am_String::Am_String(local_98,pAVar3);
  cVar2 = Am_String::operator==(local_98,&training_mode);
  Am_String::~Am_String(local_98);
  if (cVar2 == '\0') {
    pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
    Am_String::Am_String((Am_String *)&local_a0,pAVar3);
    cVar2 = Am_String::Valid();
    if (cVar2 == '\0') {
      Am_Object::Am_Object(&local_70,(Am_Object *)&Am_No_Object);
      Am_Beep((Am_Object_Data *)&local_70);
      Am_Object::~Am_Object(&local_70);
      Am_Object::Set(0x510,0x169,0);
    }
    else {
      pAVar3 = (Am_Value *)Am_Object::Get(0x510,0xa2);
      Am_Value_List::Am_Value_List((Am_Value_List *)local_98,pAVar3);
      Am_Value_List::Start();
      while( true ) {
        cVar2 = Am_Value_List::Last();
        if (cVar2 != '\0') break;
        pAVar3 = (Am_Value *)Am_Value_List::Get();
        Am_Object::Am_Object((Am_Object *)&local_80,pAVar3);
        pAVar3 = (Am_Value *)
                 Am_Object::Get((ushort)(Am_Object *)&local_80,(ulong)(ushort)CLASS_NAME);
        Am_String::Am_String((Am_String *)&local_88,pAVar3);
        cVar2 = Am_String::operator==((Am_String *)&local_88,(Am_String *)&local_a0);
        Am_String::~Am_String((Am_String *)&local_88);
        if (cVar2 != '\0') {
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&local_80);
          Am_Object::Set(0x510,(Am_Wrapper *)0x169,(ulong)pAVar4);
          Am_Object::Get_Object((ushort)&local_48,(ulong)&local_80);
          scroll_into_view(&local_48);
          Am_Object::~Am_Object(&local_48);
        }
        Am_Object::~Am_Object((Am_Object *)&local_80);
        Am_Value_List::Next();
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_98);
    }
    Am_Object::Set(0x530,0x169,0);
    Am_String::~Am_String((Am_String *)&local_a0);
  }
  else {
    pAVar3 = (Am_Value *)Am_Object::Get(0x510,0x169);
    Am_Object::Am_Object(&local_a0,pAVar3);
    cVar2 = Am_Object::Valid();
    if (cVar2 != '\0') {
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_a0,(ulong)(ushort)CLASS_NAME);
      Am_String::Am_String(&local_80,pAVar3);
      pAVar3 = (Am_Value *)Am_Object::Get((ushort)&local_a0,(ulong)(CLASS_EXAMPLES & 0xffff));
      Am_Value_List::Am_Value_List((Am_Value_List *)local_98,pAVar3);
      cVar2 = Am_Value_List::Empty();
      Am_String::Am_String(&local_58,&local_80);
      Am_Feature_Vector::Am_Feature_Vector(local_60,local_78);
      Am_Gesture_Trainer::Add_Example(&trainer,&local_58,local_60,1);
      Am_Feature_Vector::~Am_Feature_Vector(local_60);
      Am_String::~Am_String(&local_58);
      Am_Feature_Vector::Am_Feature_Vector(local_68,local_78);
      Example_Create((Am_Feature_Vector *)&local_88);
      Am_Feature_Vector::~Am_Feature_Vector(local_68);
      pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_88);
      Am_Value_List::Add((Am_Wrapper *)local_98,(Am_Add_Position)pAVar4,true);
      iVar1 = CLASS_EXAMPLES;
      if (cVar2 == '\0') {
        Am_Object::Note_Changed((ushort)&local_a0);
      }
      else {
        pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)local_98);
        Am_Object::Set((ushort)&local_a0,(Am_Wrapper *)(ulong)(iVar1 & 0xffff),(ulong)pAVar4);
      }
      dirty = true;
      Am_Object::~Am_Object(&local_88);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_98);
      Am_String::~Am_String(&local_80);
    }
    Am_Object::~Am_Object(&local_a0);
  }
  Am_Feature_Vector::~Am_Feature_Vector(local_78);
  Am_Point_List::~Am_Point_List(&local_40);
  Am_Object::~Am_Object(&local_50);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, done_gesture, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Point_List pl = inter.Get(Am_POINT_LIST);
  Am_Feature_Vector feat(pl);

  if (Am_String(mode.Get(Am_VALUE)) == training_mode) {
    Am_Object cls = class_panel.Get(Am_VALUE);
    if (cls.Valid()) {
      Am_String class_name = cls.Get(CLASS_NAME);
      Am_Value_List examples = cls.Get(CLASS_EXAMPLES);
      bool new_list = examples.Empty();

      trainer.Add_Example(class_name, feat);

      Am_Object example = Example_Create(feat);
      examples.Add(example, Am_TAIL, false);
      if (new_list)
        cls.Set(CLASS_EXAMPLES, examples);
      else
        cls.Note_Changed(CLASS_EXAMPLES);

      // select it?
      // example_panel.Set (Am_VALUE, example);

      // the classifier has changed, so set dirty flag
      dirty = true;
    }
  }

  else {
    // search for recognized class and select it
    Am_String recognized = cmd.Get(Am_VALUE);

    if (!recognized.Valid()) {
      // unrecognized!
      Am_Beep();
      class_panel.Set(Am_VALUE, 0);
    } else {
      // search for recognized class name
      Am_Value_List l = class_panel.Get(Am_ITEMS);
      for (l.Start(); !l.Last(); l.Next()) {
        Am_Object cls = l.Get();
        if (Am_String(cls.Get(CLASS_NAME)) == recognized) {
          class_panel.Set(Am_VALUE, cls);
          scroll_into_view(cls.Get_Owner());
        }
      }
    }
    example_panel.Set(Am_VALUE, 0);
  }
}